

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O2

bool read_from_file(string *file,PFT_PROGRAM_DATA ftData)

{
  char cVar1;
  ostream *poVar2;
  ifstream input_file;
  CONFIG_DATA config;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Reading ");
  poVar2 = std::operator<<(poVar2,(string *)file);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ifstream::ifstream(&input_file,(string *)file,_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to open file ");
    poVar2 = std::operator<<(poVar2,(string *)file);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::istream::read((char *)&input_file,(long)&config);
    config_to_ft(ftData,&config);
    std::istream::read((char *)&input_file,0x158540);
    std::istream::read((char *)&input_file,0x158560);
    std::istream::read((char *)&input_file,0x158570);
    std::istream::read((char *)&input_file,0x1585b0);
    std::ifstream::close();
    ftData->Manufacturer = ManufacturerBuf;
    ftData->ManufacturerId = ManufacturerIdBuf;
    ftData->Description = DescriptionBuf;
    ftData->SerialNumber = SerialNumberBuf;
  }
  std::ifstream::~ifstream(&input_file);
  return (bool)cVar1;
}

Assistant:

bool read_from_file(const string& file, PFT_PROGRAM_DATA ftData) {
    cout << "Reading " << file << endl;
    try {
        ifstream input_file(file, ios::in | ios::binary);
        if (!input_file.is_open()) {
            cerr << "Failed to open file " << file << endl;
            return false;
        }
        CONFIG_DATA config;

        input_file.read((char *) &config, sizeof(CONFIG_DATA));
        config_to_ft(ftData, &config);
        input_file.read(ManufacturerBuf, sizeof(ManufacturerBuf));
        input_file.read(ManufacturerIdBuf, sizeof(ManufacturerIdBuf));
        input_file.read(DescriptionBuf, sizeof(DescriptionBuf));
        input_file.read(SerialNumberBuf, sizeof(SerialNumberBuf));
        input_file.close();
        ftData->Manufacturer = ManufacturerBuf;
        ftData->ManufacturerId = ManufacturerIdBuf;
        ftData->Description = DescriptionBuf;
        ftData->SerialNumber = SerialNumberBuf;
    } catch (...) {
        cerr << "Failed to read file " << file << endl;
        return false;
    }
    return true;
}